

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cc
# Opt level: O3

Status __thiscall
VirtualFileSystem::ReadFile(VirtualFileSystem *this,string *path,string *contents,string *err)

{
  char *pcVar1;
  iterator iVar2;
  char *__s;
  bool bVar3;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->files_read_,path);
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VirtualFileSystem::Entry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VirtualFileSystem::Entry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VirtualFileSystem::Entry>_>_>
          ::find(&(this->files_)._M_t,path);
  bVar3 = (_Rb_tree_header *)iVar2._M_node == &(this->files_)._M_t._M_impl.super__Rb_tree_header;
  if (bVar3) {
    __s = strerror(2);
    pcVar1 = (char *)err->_M_string_length;
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)err,0,pcVar1,(ulong)__s);
  }
  else {
    std::__cxx11::string::_M_assign((string *)contents);
  }
  return (uint)bVar3;
}

Assistant:

FileReader::Status VirtualFileSystem::ReadFile(const string& path,
                                               string* contents,
                                               string* err) {
  files_read_.push_back(path);
  FileMap::iterator i = files_.find(path);
  if (i != files_.end()) {
    *contents = i->second.contents;
    return Okay;
  }
  *err = strerror(ENOENT);
  return NotFound;
}